

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

NETSOCKET net_tcp_create(NETADDR bindaddr)

{
  long lVar1;
  NETADDR NVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  NETSOCKET NVar7;
  sockaddr_in addr;
  NETADDR tmpbindaddr;
  
  NVar2 = bindaddr;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tmpbindaddr.ip[0xc] = bindaddr.ip[0xc];
  tmpbindaddr.ip[0xd] = bindaddr.ip[0xd];
  tmpbindaddr.ip[0xe] = bindaddr.ip[0xe];
  tmpbindaddr.ip[0xf] = bindaddr.ip[0xf];
  tmpbindaddr.port = bindaddr.port;
  tmpbindaddr.reserved = bindaddr.reserved;
  tmpbindaddr._0_8_ = NVar2._0_8_;
  tmpbindaddr.ip[4] = bindaddr.ip[4];
  tmpbindaddr.ip[5] = bindaddr.ip[5];
  tmpbindaddr.ip[6] = bindaddr.ip[6];
  tmpbindaddr.ip[7] = bindaddr.ip[7];
  tmpbindaddr.ip[8] = bindaddr.ip[8];
  tmpbindaddr.ip[9] = bindaddr.ip[9];
  tmpbindaddr.ip[10] = bindaddr.ip[10];
  tmpbindaddr.ip[0xb] = bindaddr.ip[0xb];
  uVar6 = 0;
  uVar5 = 0xffffffff00000000;
  if (((undefined1  [24])NVar2 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    tmpbindaddr.ip._0_4_ = NVar2.ip._0_4_;
    tmpbindaddr.type = 1;
    netaddr_to_sockaddr_in(&tmpbindaddr,&addr);
    uVar3 = priv_net_create_socket(2,1,(sockaddr *)&addr,0x10,0);
    uVar6 = (ulong)(-1 < (int)uVar3);
    if (-1 < (int)uVar3) {
      uVar5 = (ulong)uVar3 << 0x20;
    }
  }
  if (((undefined1  [24])NVar2 & (undefined1  [24])0x2) == (undefined1  [24])0x0) {
    iVar4 = -1;
  }
  else {
    tmpbindaddr.type = 2;
    netaddr_to_sockaddr_in6(&tmpbindaddr,(sockaddr_in6 *)&addr);
    iVar4 = priv_net_create_socket(10,1,(sockaddr *)&addr,0x1c,0);
    uVar3 = (uint)uVar6 + 2;
    if (iVar4 < 0) {
      uVar3 = (uint)uVar6;
    }
    uVar6 = (ulong)uVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    NVar7.ipv6sock = iVar4;
    NVar7.type = (int)(uVar5 | uVar6);
    NVar7.ipv4sock = (int)((uVar5 | uVar6) >> 0x20);
    return NVar7;
  }
  __stack_chk_fail();
}

Assistant:

NETSOCKET net_tcp_create(NETADDR bindaddr)
{
	NETSOCKET sock = invalid_socket;
	NETADDR tmpbindaddr = bindaddr;

	if(bindaddr.type&NETTYPE_IPV4)
	{
		struct sockaddr_in addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV4;
		netaddr_to_sockaddr_in(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET, SOCK_STREAM, (struct sockaddr *)&addr, sizeof(addr), 0);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV4;
			sock.ipv4sock = socket;
		}
	}

	if(bindaddr.type&NETTYPE_IPV6)
	{
		struct sockaddr_in6 addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV6;
		netaddr_to_sockaddr_in6(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET6, SOCK_STREAM, (struct sockaddr *)&addr, sizeof(addr), 0);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV6;
			sock.ipv6sock = socket;
		}
	}

	/* return */
	return sock;
}